

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_data_converter_process_pcm_frames__resample_only
                    (ma_data_converter *pConverter,void *pFramesIn,ma_uint64 *pFrameCountIn,
                    void *pFramesOut,ma_uint64 *pFrameCountOut)

{
  ma_uint64 *pFrameCountOut_local;
  void *pFramesOut_local;
  ma_uint64 *pFrameCountIn_local;
  void *pFramesIn_local;
  ma_data_converter *pConverter_local;
  
  if (pConverter != (ma_data_converter *)0x0) {
    if (((pConverter->field_0x2768 & 1) == 0) && (((byte)pConverter->field_0x2768 >> 1 & 1) == 0)) {
      pConverter_local._4_4_ =
           ma_resampler_process_pcm_frames
                     (&pConverter->resampler,pFramesIn,pFrameCountIn,pFramesOut,pFrameCountOut);
    }
    else {
      pConverter_local._4_4_ =
           ma_data_converter_process_pcm_frames__resample_with_format_conversion
                     (pConverter,pFramesIn,pFrameCountIn,pFramesOut,pFrameCountOut);
    }
    return pConverter_local._4_4_;
  }
  __assert_fail("pConverter != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                ,0x8798,
                "ma_result ma_data_converter_process_pcm_frames__resample_only(ma_data_converter *, const void *, ma_uint64 *, void *, ma_uint64 *)"
               );
}

Assistant:

static ma_result ma_data_converter_process_pcm_frames__resample_only(ma_data_converter* pConverter, const void* pFramesIn, ma_uint64* pFrameCountIn, void* pFramesOut, ma_uint64* pFrameCountOut)
{
    MA_ASSERT(pConverter != NULL);

    if (pConverter->hasPreFormatConversion == MA_FALSE && pConverter->hasPostFormatConversion == MA_FALSE) {
        /* Neither pre- nor post-format required. This is simple case where only resampling is required. */
        return ma_resampler_process_pcm_frames(&pConverter->resampler, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
    } else {
        /* Format conversion required. */
        return ma_data_converter_process_pcm_frames__resample_with_format_conversion(pConverter, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
    }
}